

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::XGLImporter::CanRead(XGLImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  char *pcStack_78;
  char *tokens [3];
  undefined1 local_50 [8];
  string extension;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  XGLImporter *this_local;
  
  extension.field_2._M_local_buf[0xf] = checkSig;
  BaseImporter::GetExtension((string *)local_50,pFile);
  bVar1 = std::operator==((string *)local_50,"xgl");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"zgl");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,"xml");
      if ((bVar1) || ((extension.field_2._M_local_buf[0xf] & 1U) != 0)) {
        if (pIOHandler == (IOSystem *)0x0) {
          __assert_fail("pIOHandler != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/XGL/XGLLoader.cpp"
                        ,0x7e,
                        "virtual bool Assimp::XGLImporter::CanRead(const std::string &, IOSystem *, bool) const"
                       );
        }
        tokens[1] = "<WORLD>";
        pcStack_78 = "<world>";
        tokens[0] = "<World>";
        this_local._7_1_ =
             BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&pcStack_78,3,200,false,false);
      }
      else {
        this_local._7_1_ = false;
      }
      goto LAB_009ba8c8;
    }
  }
  this_local._7_1_ = true;
LAB_009ba8c8:
  tokens[2]._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool XGLImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    /* NOTE: A simple check for the file extension is not enough
     * here. XGL and ZGL are ok, but xml is too generic
     * and might be collada as well. So open the file and
     * look for typical signal tokens.
     */
    const std::string extension = GetExtension(pFile);

    if (extension == "xgl" || extension == "zgl") {
        return true;
    }
    else if (extension == "xml" || checkSig) {
        ai_assert(pIOHandler != NULL);

        const char* tokens[] = {"<world>","<World>","<WORLD>"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,3);
    }
    return false;
}